

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void re2::ConvertRunesToBytes(bool latin1,Rune *runes,int nrunes,string *bytes)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000039;
  pointer str;
  ulong uVar3;
  bool bVar4;
  
  if ((int)CONCAT71(in_register_00000039,latin1) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
               (long)nrunes);
    uVar2 = 0;
    uVar3 = (ulong)(uint)nrunes;
    if (nrunes < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      (bytes->_M_dataplus)._M_p[uVar2] = (char)runes[uVar2];
    }
    return;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
             (long)(nrunes * 4));
  str = (bytes->_M_dataplus)._M_p;
  uVar3 = 0;
  if (0 < nrunes) {
    uVar3 = (ulong)(uint)nrunes;
  }
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    iVar1 = runetochar(str,runes);
    str = str + iVar1;
    runes = runes + 1;
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
             (long)str - (long)(bytes->_M_dataplus)._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
            (bytes);
  return;
}

Assistant:

void ConvertRunesToBytes(bool latin1, Rune* runes, int nrunes,
                         std::string* bytes) {
  if (latin1) {
    bytes->resize(nrunes);
    for (int i = 0; i < nrunes; i++)
      (*bytes)[i] = static_cast<char>(runes[i]);
  } else {
    bytes->resize(nrunes * UTFmax);  // worst case
    char* p = &(*bytes)[0];
    for (int i = 0; i < nrunes; i++)
      p += runetochar(p, &runes[i]);
    bytes->resize(p - &(*bytes)[0]);
    bytes->shrink_to_fit();
  }
}